

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O0

DdNode * cuddBddSqueeze(DdManager *dd,DdNode *l,DdNode *u)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  bool bVar5;
  DdNode *local_98;
  DdNode *local_90;
  DdNode *temp;
  int index;
  uint topl;
  uint topu;
  int comple;
  DdNode *e;
  DdNode *t;
  DdNode *ue;
  DdNode *ut;
  DdNode *le;
  DdNode *lt;
  DdNode *r;
  DdNode *zero;
  DdNode *one;
  DdNode *u_local;
  DdNode *l_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)l;
  if (l != u) {
    pDVar4 = dd->one;
    pDVar2 = (DdNode *)((ulong)pDVar4 ^ 1);
    if ((l != pDVar2) && (dd_local = (DdManager *)u, u != pDVar4)) {
      bVar5 = ((ulong)u & 1) != 0;
      one = u;
      u_local = l;
      if (bVar5) {
        one = (DdNode *)((ulong)l ^ 1);
        u_local = (DdNode *)((ulong)u ^ 1);
      }
      topl = (uint)bVar5;
      pDVar3 = cuddCacheLookup2(dd,Cudd_bddSqueeze,u_local,one);
      if (pDVar3 == (DdNode *)0x0) {
        if ((uint)dd->perm[*(uint *)((ulong)u_local & 0xfffffffffffffffe)] <
            (uint)dd->perm[one->index]) {
          temp._0_4_ = *(DdHalfWord *)((ulong)u_local & 0xfffffffffffffffe);
          t = one;
          ue = one;
        }
        else {
          temp._0_4_ = one->index;
          ue = (one->type).kids.T;
          t = (one->type).kids.E;
        }
        if ((uint)dd->perm[one->index] <
            (uint)dd->perm[*(uint *)((ulong)u_local & 0xfffffffffffffffe)]) {
          ut = u_local;
          le = u_local;
        }
        else {
          le = *(DdNode **)(((ulong)u_local & 0xfffffffffffffffe) + 0x10);
          ut = *(DdNode **)(((ulong)u_local & 0xfffffffffffffffe) + 0x18);
          if (((ulong)u_local & 1) != 0) {
            le = (DdNode *)((ulong)le ^ 1);
            ut = (DdNode *)((ulong)ut ^ 1);
          }
        }
        if (((le == pDVar2) || (iVar1 = Cudd_bddLeq(dd,le,ut), iVar1 != 0)) &&
           ((ue == pDVar4 || (iVar1 = Cudd_bddLeq(dd,t,ue), iVar1 != 0)))) {
          pDVar4 = cuddBddSqueeze(dd,ut,t);
          if (pDVar4 == (DdNode *)0x0) {
            dd_local = (DdManager *)0x0;
          }
          else {
            dd_local = (DdManager *)((ulong)pDVar4 ^ (long)(int)topl);
          }
        }
        else if (((ut == pDVar2) || (iVar1 = Cudd_bddLeq(dd,ut,le), iVar1 != 0)) &&
                ((t == pDVar4 || (iVar1 = Cudd_bddLeq(dd,ue,t), iVar1 != 0)))) {
          pDVar4 = cuddBddSqueeze(dd,le,ue);
          if (pDVar4 == (DdNode *)0x0) {
            dd_local = (DdManager *)0x0;
          }
          else {
            dd_local = (DdManager *)((ulong)pDVar4 ^ (long)(int)topl);
          }
        }
        else if (((ut == pDVar2) ||
                 (iVar1 = Cudd_bddLeq(dd,ut,(DdNode *)((ulong)ue ^ 1)), iVar1 != 0)) &&
                ((t == pDVar4 || (iVar1 = Cudd_bddLeq(dd,(DdNode *)((ulong)le ^ 1),t), iVar1 != 0)))
                ) {
          pDVar4 = cuddBddSqueeze(dd,le,ue);
          *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
          if (((ulong)pDVar4 & 1) == 0) {
            lt = cuddUniqueInter(dd,(DdHalfWord)temp,pDVar4,(DdNode *)((ulong)pDVar4 ^ 1));
            if (lt == (DdNode *)0x0) {
              Cudd_IterDerefBdd(dd,pDVar4);
              return (DdNode *)0x0;
            }
          }
          else {
            pDVar2 = cuddUniqueInter(dd,(DdHalfWord)temp,(DdNode *)((ulong)pDVar4 ^ 1),pDVar4);
            if (pDVar2 == (DdNode *)0x0) {
              Cudd_IterDerefBdd(dd,pDVar4);
              return (DdNode *)0x0;
            }
            lt = (DdNode *)((ulong)pDVar2 ^ 1);
          }
          *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + -1;
          if (lt == (DdNode *)0x0) {
            dd_local = (DdManager *)0x0;
          }
          else {
            cuddCacheInsert2(dd,Cudd_bddSqueeze,u_local,one,lt);
            dd_local = (DdManager *)((ulong)lt ^ (long)(int)topl);
          }
        }
        else if (((le == pDVar2) ||
                 (iVar1 = Cudd_bddLeq(dd,le,(DdNode *)((ulong)t ^ 1)), iVar1 != 0)) &&
                ((ue == pDVar4 || (iVar1 = Cudd_bddLeq(dd,(DdNode *)((ulong)ut ^ 1),ue), iVar1 != 0)
                 ))) {
          pDVar4 = cuddBddSqueeze(dd,ut,t);
          *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
          if (((ulong)pDVar4 & 1) == 0) {
            pDVar2 = cuddUniqueInter(dd,(DdHalfWord)temp,pDVar4,(DdNode *)((ulong)pDVar4 ^ 1));
            if (pDVar2 == (DdNode *)0x0) {
              Cudd_IterDerefBdd(dd,pDVar4);
              return (DdNode *)0x0;
            }
            lt = (DdNode *)((ulong)pDVar2 ^ 1);
          }
          else {
            lt = cuddUniqueInter(dd,(DdHalfWord)temp,(DdNode *)((ulong)pDVar4 ^ 1),pDVar4);
            if (lt == (DdNode *)0x0) {
              Cudd_IterDerefBdd(dd,pDVar4);
              return (DdNode *)0x0;
            }
          }
          *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + -1;
          if (lt == (DdNode *)0x0) {
            dd_local = (DdManager *)0x0;
          }
          else {
            cuddCacheInsert2(dd,Cudd_bddSqueeze,u_local,one,lt);
            dd_local = (DdManager *)((ulong)lt ^ (long)(int)topl);
          }
        }
        else {
          e = cuddBddSqueeze(dd,le,ue);
          if (e == (DdNode *)0x0) {
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + 1;
            _topu = cuddBddSqueeze(dd,ut,t);
            if (_topu == (DdNode *)0x0) {
              Cudd_IterDerefBdd(dd,e);
              dd_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)_topu & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)_topu & 0xfffffffffffffffe) + 4) + 1;
              if (((ulong)e & 1) == 0) {
                local_98 = e;
                if (e != _topu) {
                  local_98 = cuddUniqueInter(dd,(DdHalfWord)temp,e,_topu);
                }
                lt = local_98;
                if (local_98 == (DdNode *)0x0) {
                  Cudd_IterDerefBdd(dd,_topu);
                  Cudd_IterDerefBdd(dd,e);
                  return (DdNode *)0x0;
                }
              }
              else {
                e = (DdNode *)((ulong)e ^ 1);
                _topu = (DdNode *)((ulong)_topu ^ 1);
                local_90 = e;
                if (e != _topu) {
                  local_90 = cuddUniqueInter(dd,(DdHalfWord)temp,e,_topu);
                }
                if (local_90 == (DdNode *)0x0) {
                  Cudd_IterDerefBdd(dd,_topu);
                  Cudd_IterDerefBdd(dd,e);
                  return (DdNode *)0x0;
                }
                lt = (DdNode *)((ulong)local_90 ^ 1);
              }
              *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + -1;
              *(int *)(((ulong)_topu & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)_topu & 0xfffffffffffffffe) + 4) + -1;
              cuddCacheInsert2(dd,Cudd_bddSqueeze,u_local,one,lt);
              dd_local = (DdManager *)((ulong)lt ^ (long)(int)topl);
            }
          }
        }
      }
      else {
        dd_local = (DdManager *)((ulong)pDVar3 ^ (long)(int)topl);
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
cuddBddSqueeze(
  DdManager * dd,
  DdNode * l,
  DdNode * u)
{
    DdNode *one, *zero, *r, *lt, *le, *ut, *ue, *t, *e;
#if 0
    DdNode *ar;
#endif
    int comple = 0;
    unsigned int topu, topl;
    int index;

    statLine(dd);
    if (l == u) {
        return(l);
    }
    one = DD_ONE(dd);
    zero = Cudd_Not(one);
    /* The only case when l == zero && u == one is at the top level,
    ** where returning either one or zero is OK. In all other cases
    ** the procedure will detect such a case and will perform
    ** remapping. Therefore the order in which we test l and u at this
    ** point is immaterial. */
    if (l == zero) return(l);
    if (u == one)  return(u);

    /* Make canonical to increase the utilization of the cache. */
    if (Cudd_IsComplement(u)) {
        DdNode *temp;
        temp = Cudd_Not(l);
        l = Cudd_Not(u);
        u = temp;
        comple = 1;
    }
    /* At this point u is regular and non-constant; l is non-constant, but
    ** may be complemented. */

    /* Here we could check the relative sizes. */

    /* Check the cache. */
    r = cuddCacheLookup2(dd, Cudd_bddSqueeze, l, u);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple));
    }

    /* Recursive step. */
    topu = dd->perm[u->index];
    topl = dd->perm[Cudd_Regular(l)->index];
    if (topu <= topl) {
        index = u->index;
        ut = cuddT(u); ue = cuddE(u);
    } else {
        index = Cudd_Regular(l)->index;
        ut = ue = u;
    }
    if (topl <= topu) {
        lt = cuddT(Cudd_Regular(l)); le = cuddE(Cudd_Regular(l));
        if (Cudd_IsComplement(l)) {
            lt = Cudd_Not(lt);
            le = Cudd_Not(le);
        }
    } else {
        lt = le = l;
    }

    /* If one interval is contained in the other, use the smaller
    ** interval. This corresponds to one-sided matching. */
    if ((lt == zero || Cudd_bddLeq(dd,lt,le)) &&
        (ut == one  || Cudd_bddLeq(dd,ue,ut))) { /* remap */
        r = cuddBddSqueeze(dd, le, ue);
        if (r == NULL)
            return(NULL);
        return(Cudd_NotCond(r,comple));
    } else if ((le == zero || Cudd_bddLeq(dd,le,lt)) &&
               (ue == one  || Cudd_bddLeq(dd,ut,ue))) { /* remap */
        r = cuddBddSqueeze(dd, lt, ut);
        if (r == NULL)
            return(NULL);
        return(Cudd_NotCond(r,comple));
    } else if ((le == zero || Cudd_bddLeq(dd,le,Cudd_Not(ut))) &&
               (ue == one  || Cudd_bddLeq(dd,Cudd_Not(lt),ue))) { /* c-remap */
        t = cuddBddSqueeze(dd, lt, ut);
        cuddRef(t);
        if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(dd, index, Cudd_Not(t), t);
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, t);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(dd, index, t, Cudd_Not(t));
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, t);
                return(NULL);
            }
        }
        cuddDeref(t);
        if (r == NULL)
            return(NULL);
        cuddCacheInsert2(dd, Cudd_bddSqueeze, l, u, r);
        return(Cudd_NotCond(r,comple));
    } else if ((lt == zero || Cudd_bddLeq(dd,lt,Cudd_Not(ue))) &&
               (ut == one  || Cudd_bddLeq(dd,Cudd_Not(le),ut))) { /* c-remap */
        e = cuddBddSqueeze(dd, le, ue);
        cuddRef(e);
        if (Cudd_IsComplement(e)) {
            r = cuddUniqueInter(dd, index, Cudd_Not(e), e);
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, e);
                return(NULL);
            }
        } else {
            r = cuddUniqueInter(dd, index, e, Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, e);
                return(NULL);
            }
            r = Cudd_Not(r);
        }
        cuddDeref(e);
        if (r == NULL)
            return(NULL);
        cuddCacheInsert2(dd, Cudd_bddSqueeze, l, u, r);
        return(Cudd_NotCond(r,comple));
    }

#if 0
    /* If the two intervals intersect, take a solution from
    ** the intersection of the intervals. This guarantees that the
    ** splitting variable will not appear in the result.
    ** This approach corresponds to two-sided matching, and is very
    ** expensive. */
    if (Cudd_bddLeq(dd,lt,ue) && Cudd_bddLeq(dd,le,ut)) {
        DdNode *au, *al;
        au = cuddBddAndRecur(dd,ut,ue);
        if (au == NULL)
            return(NULL);
        cuddRef(au);
        al = cuddBddAndRecur(dd,Cudd_Not(lt),Cudd_Not(le));
        if (al == NULL) {
            Cudd_IterDerefBdd(dd,au);
            return(NULL);
        }
        cuddRef(al);
        al = Cudd_Not(al);
        ar = cuddBddSqueeze(dd, al, au);
        if (ar == NULL) {
            Cudd_IterDerefBdd(dd,au);
            Cudd_IterDerefBdd(dd,al);
            return(NULL);
        }
        cuddRef(ar);
        Cudd_IterDerefBdd(dd,au);
        Cudd_IterDerefBdd(dd,al);
    } else {
        ar = NULL;
    }
#endif

    t = cuddBddSqueeze(dd, lt, ut);
    if (t == NULL) {
        return(NULL);
    }
    cuddRef(t);
    e = cuddBddSqueeze(dd, le, ue);
    if (e == NULL) {
        Cudd_IterDerefBdd(dd,t);
        return(NULL);
    }
    cuddRef(e);

    if (Cudd_IsComplement(t)) {
        t = Cudd_Not(t);
        e = Cudd_Not(e);
        r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
        if (r == NULL) {
            Cudd_IterDerefBdd(dd, e);
            Cudd_IterDerefBdd(dd, t);
            return(NULL);
        }
        r = Cudd_Not(r);
    } else {
        r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
        if (r == NULL) {
            Cudd_IterDerefBdd(dd, e);
            Cudd_IterDerefBdd(dd, t);
            return(NULL);
        }
    }
    cuddDeref(t);
    cuddDeref(e);

#if 0
    /* Check whether there is a result obtained by abstraction and whether
    ** it is better than the one obtained by recursion. */
    cuddRef(r);
    if (ar != NULL) {
        if (Cudd_DagSize(ar) <= Cudd_DagSize(r)) {
            Cudd_IterDerefBdd(dd, r);
            r = ar;
        } else {
            Cudd_IterDerefBdd(dd, ar);
        }
    }
    cuddDeref(r);
#endif

    cuddCacheInsert2(dd, Cudd_bddSqueeze, l, u, r);
    return(Cudd_NotCond(r,comple));

}